

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall
llvm::yaml::Scanner::rollIndent(Scanner *this,int ToColumn,TokenKind Kind,iterator InsertPoint)

{
  StringRef local_70;
  undefined1 local_60 [8];
  Token T;
  TokenKind Kind_local;
  int ToColumn_local;
  Scanner *this_local;
  iterator InsertPoint_local;
  
  if ((this->FlowLevel == 0) && (this->Indent < ToColumn)) {
    T.Value.field_2._8_4_ = Kind;
    T.Value.field_2._12_4_ = ToColumn;
    SmallVectorTemplateBase<int,_true>::push_back
              ((SmallVectorTemplateBase<int,_true> *)&this->Indents,&this->Indent);
    this->Indent = T.Value.field_2._12_4_;
    Token::Token((Token *)local_60);
    local_60._0_4_ = T.Value.field_2._8_4_;
    StringRef::StringRef(&local_70,this->Current,0);
    T._0_8_ = local_70.Data;
    T.Range.Data = (char *)local_70.Length;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::insert(&this->TokenQueue,InsertPoint,(Token *)local_60);
    Token::~Token((Token *)local_60);
  }
  return true;
}

Assistant:

bool Scanner::rollIndent( int ToColumn
                        , Token::TokenKind Kind
                        , TokenQueueT::iterator InsertPoint) {
  if (FlowLevel)
    return true;
  if (Indent < ToColumn) {
    Indents.push_back(Indent);
    Indent = ToColumn;

    Token T;
    T.Kind = Kind;
    T.Range = StringRef(Current, 0);
    TokenQueue.insert(InsertPoint, T);
  }
  return true;
}